

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor_test.cpp
# Opt level: O0

void __thiscall preprocessor_test_foreach_Test::TestBody(preprocessor_test_foreach_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  char for_each_str [4];
  AssertHelper local_40;
  Message local_38 [3];
  AssertionResult local_20;
  char local_c [12];
  
  local_c[0] = '\0';
  local_c[1] = '\0';
  local_c[2] = '\0';
  local_c[3] = '\0';
  strncat(local_c,"a",3);
  strncat(local_c,"b",3);
  strncat(local_c,"c",3);
  testing::internal::CmpHelperSTREQ((internal *)&local_20,"for_each_str","\"abc\"",local_c,"abc");
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    testing::Message::Message(local_38);
    message = testing::AssertionResult::failure_message((AssertionResult *)0x11037e);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0x8b,message);
    testing::internal::AssertHelper::operator=(&local_40,local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::Message::~Message((Message *)0x1103ca);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11040a);
  return;
}

Assistant:

TEST_F(preprocessor_test, foreach)
{
#define PREPROCESSOR_TEST_FOR_EACH_STR_SIZE 0x04

	char for_each_str[PREPROCESSOR_TEST_FOR_EACH_STR_SIZE];

	memset(for_each_str, '\0', sizeof(char) * PREPROCESSOR_TEST_FOR_EACH_STR_SIZE);

#define PREPROCESSOR_TEST_FOR_EACH(expr) strncat(for_each_str, expr, PREPROCESSOR_TEST_FOR_EACH_STR_SIZE - 1);

	PREPROCESSOR_FOR_EACH(PREPROCESSOR_TEST_FOR_EACH, "a", "b", "c")

#undef PREPROCESSOR_TEST_FOR_EACH

#undef PREPROCESSOR_TEST_FOR_EACH_STR_SIZE

	EXPECT_STREQ(for_each_str, "abc");
}